

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetTxInSequence_Test::ConfidentialTransaction_SetTxInSequence_Test
          (ConfidentialTransaction_SetTxInSequence_Test *this)

{
  ConfidentialTransaction_SetTxInSequence_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialTransaction_SetTxInSequence_Test_00891d90;
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetTxInSequence) {
  std::string tx_hex = "020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000ffffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000";
  ConfidentialTransaction tx(tx_hex);
  tx.SetTxInSequence(0, 4294967294);
  EXPECT_EQ(
      "020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000feffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000",
      tx.GetHex());
}